

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_detection.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
__thiscall
duckdb::CSVSniffer::DetectHeaderInternal_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *__return_storage_ptr__,CSVSniffer *this,ClientContext *context,
          vector<duckdb::HeaderValue,_true> *best_header_row,CSVStateMachine *state_machine,
          SetColumns *set_columns,
          unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
          *best_sql_types_candidates_per_column_idx,CSVReaderOptions *options,
          MultiFileOptions *file_options,CSVErrorHandler *error_handler)

{
  size_type *psVar1;
  pointer *ppHVar2;
  element_type *peVar3;
  element_type *peVar4;
  StateMachine *pSVar5;
  size_type sVar6;
  pointer pcVar7;
  char cVar8;
  byte bVar9;
  bool bVar10;
  KeywordCategory KVar11;
  mapped_type *this_00;
  reference this_01;
  reference pvVar12;
  reference pvVar13;
  long strlen;
  utf8proc_uint8_t *puVar14;
  size_t sVar15;
  iterator iVar16;
  mapped_type *pmVar17;
  undefined8 *puVar18;
  InternalException *this_02;
  ulong uVar19;
  byte bVar20;
  idx_t iVar21;
  pointer total_cols;
  char cVar22;
  size_type __n;
  size_type sVar23;
  undefined8 uVar24;
  _Alloc_hider _Var25;
  byte bVar26;
  char *__end;
  ulong uVar27;
  byte bVar28;
  char *__end_2;
  string *__range1;
  string *col_name;
  pointer pHVar29;
  string_t value;
  string col_name_nfkd;
  string col_name_ascii;
  string col_name_trimmed;
  string local_120;
  CSVStateMachine *local_100;
  uint local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  LogicalType *local_e8;
  string local_e0;
  CSVError error;
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pHVar29 = (pointer)set_columns[1].names;
  best_header_row[5].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
  super__Vector_impl_data._M_finish = pHVar29;
  peVar3 = (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar4 = (element_type *)
           (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
           super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_100 = (CSVStateMachine *)set_columns;
  if (peVar3 == peVar4) {
    *(undefined2 *)
     &best_header_row[5].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
      super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = 0;
    if (pHVar29 != (pointer)0x0) {
      iVar21 = 0;
      do {
        col_name_nfkd._M_dataplus._M_p = (pointer)&col_name_nfkd.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&col_name_nfkd,"column","");
        GenerateColumnName(&error.error_message,(idx_t)pHVar29,iVar21,&col_name_nfkd);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&error.error_message);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)error.error_message._M_dataplus._M_p != &error.error_message.field_2) {
          operator_delete(error.error_message._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)col_name_nfkd._M_dataplus._M_p != &col_name_nfkd.field_2) {
          operator_delete(col_name_nfkd._M_dataplus._M_p);
        }
        iVar21 = iVar21 + 1;
        pHVar29 = best_header_row[5].
                  super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      } while (iVar21 < pHVar29);
    }
LAB_01502963:
    ReplaceNames((duckdb *)__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)best_header_row,local_100,best_sql_types_candidates_per_column_idx,
                 (CSVReaderOptions *)
                 (ulong)(byte)(options->dialect_options).state_machine_options.delimiter.field_0x1,
                 (MultiFileOptions *)
                 (ulong)(byte)(options->dialect_options).state_machine_options.delimiter.field_0x3,
                 (vector<duckdb::HeaderValue,_true> *)context,(CSVErrorHandler *)file_options);
  }
  else {
    if ((*(char *)&best_sql_types_candidates_per_column_idx[0xc]._M_h._M_rehash_policy.
                   _M_max_load_factor == '\0') &&
       (pHVar29 != (pointer)(((long)peVar4 - (long)peVar3 >> 3) * -0x3333333333333333))) {
      if (*(char *)((long)&best_sql_types_candidates_per_column_idx[2]._M_h._M_rehash_policy.
                           _M_max_load_factor + 1) == '\x01') {
        *(undefined2 *)
         &best_header_row[5].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>
          .super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = 0;
        if (pHVar29 != (pointer)0x0) {
          iVar21 = 0;
          do {
            col_name_nfkd._M_dataplus._M_p = (pointer)&col_name_nfkd.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&col_name_nfkd,"column","");
            GenerateColumnName(&error.error_message,(idx_t)pHVar29,iVar21,&col_name_nfkd);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       __return_storage_ptr__,&error.error_message);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)error.error_message._M_dataplus._M_p != &error.error_message.field_2) {
              operator_delete(error.error_message._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)col_name_nfkd._M_dataplus._M_p != &col_name_nfkd.field_2) {
              operator_delete(col_name_nfkd._M_dataplus._M_p);
            }
            iVar21 = iVar21 + 1;
            pHVar29 = best_header_row[5].
                      super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                      super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          } while (iVar21 < pHVar29);
        }
        ppHVar2 = &best_header_row[8].
                   super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                   super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
        *ppHVar2 = (pointer)&(*ppHVar2)->field_0x1;
        goto LAB_01502963;
      }
      CSVError::HeaderSniffingError
                (&error,(CSVReaderOptions *)best_sql_types_candidates_per_column_idx,
                 (vector<duckdb::HeaderValue,_true> *)context,(idx_t)pHVar29,
                 (string *)
                 &best_header_row[3].
                  super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                  super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                  _M_impl.super__Vector_impl_data._M_finish);
      CSVErrorHandler::Error((CSVErrorHandler *)file_options,&error,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error.csv_row._M_dataplus._M_p != &error.csv_row.field_2) {
        operator_delete(error.csv_row._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(error.full_error_message._M_dataplus._M_p._4_4_,
                      error.full_error_message._M_dataplus._M_p._0_4_) !=
          &error.full_error_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(error.full_error_message._M_dataplus._M_p._4_4_,
                                 error.full_error_message._M_dataplus._M_p._0_4_));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)error.error_message._M_dataplus._M_p != &error.error_message.field_2) {
        operator_delete(error.error_message._M_dataplus._M_p);
      }
    }
    pSVar5 = state_machine->transition_array;
    if ((pSVar5 == (StateMachine *)0x0) ||
       (*(long *)pSVar5->state_machine[0] == *(long *)(pSVar5->state_machine[0] + 8))) {
      col_name_nfkd._M_dataplus._M_p = (pointer)0x0;
      if ((element_type *)
          (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
          (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
        bVar9 = true;
      }
      else {
        local_e8 = (LogicalType *)(best_header_row + 3);
        bVar20 = 1;
        bVar26 = 1;
        bVar9 = 1;
        bVar28 = 1;
        do {
          pvVar12 = vector<duckdb::HeaderValue,_true>::operator[]
                              ((vector<duckdb::HeaderValue,_true> *)context,
                               (size_type)col_name_nfkd._M_dataplus._M_p);
          bVar20 = bVar20 & pvVar12->is_null;
          this_00 = ::std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_100,(key_type *)&col_name_nfkd);
          this_01 = vector<duckdb::LogicalType,_true>::back(this_00);
          LogicalType::LogicalType((LogicalType *)&error,VARCHAR);
          bVar10 = LogicalType::operator==(this_01,(LogicalType *)&error);
          LogicalType::~LogicalType((LogicalType *)&error);
          if (!bVar10) {
            pvVar12 = vector<duckdb::HeaderValue,_true>::operator[]
                                ((vector<duckdb::HeaderValue,_true> *)context,
                                 (size_type)col_name_nfkd._M_dataplus._M_p);
            pcVar7 = (pvVar12->value)._M_dataplus._M_p;
            local_f8 = (uint)(pvVar12->value)._M_string_length;
            if (local_f8 < 0xd) {
              uStack_ec = 0;
              uStack_f4 = 0;
              uStack_f0 = 0;
              if (local_f8 != 0) {
                switchD_012b9b0d::default(&uStack_f4,pcVar7,(ulong)(local_f8 & 0xf));
              }
            }
            else {
              uStack_f4 = *(undefined4 *)pcVar7;
              uStack_f0 = SUB84(pcVar7,0);
              uStack_ec = (undefined4)((ulong)pcVar7 >> 0x20);
            }
            cVar22 = 'N';
            pvVar12 = vector<duckdb::HeaderValue,_true>::operator[]
                                ((vector<duckdb::HeaderValue,_true> *)context,
                                 (size_type)col_name_nfkd._M_dataplus._M_p);
            value.value._4_1_ = (undefined1)uStack_ec;
            value.value._5_1_ = uStack_ec._1_1_;
            value.value._6_1_ = uStack_ec._2_1_;
            value.value._7_1_ = uStack_ec._3_1_;
            value.value.pointer.length = uStack_f0;
            value.value.pointer.ptr = (char *)this_01;
            bVar10 = CanYouCastIt(this,(ClientContext *)CONCAT44(uStack_f4,local_f8),value,local_e8,
                                  (DialectOptions *)(ulong)pvVar12->is_null,
                                  *(bool *)best_sql_types_candidates_per_column_idx[0xc]._M_h.
                                           _M_buckets,cVar22);
            bVar26 = 0;
            bVar28 = bVar9;
            if (!bVar10) {
              bVar28 = bVar26;
              bVar9 = 0;
            }
          }
          col_name_nfkd._M_dataplus._M_p = col_name_nfkd._M_dataplus._M_p + 1;
        } while (col_name_nfkd._M_dataplus._M_p <
                 (pointer)(((long)(context->super_enable_shared_from_this<duckdb::ClientContext>).
                                  __weak_this_.internal.
                                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi -
                            (long)(context->super_enable_shared_from_this<duckdb::ClientContext>).
                                  __weak_this_.internal.
                                  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr >> 3) * -0x3333333333333333));
        bVar9 = true;
        if (bVar26 == 0 && bVar20 == 0) {
          bVar9 = bVar28 ^ 1;
        }
      }
    }
    else {
      bVar9 = DetectHeaderWithSetColumn
                        ((ClientContext *)this,(vector<duckdb::HeaderValue,_true> *)context,
                         (SetColumns *)state_machine,
                         (CSVReaderOptions *)best_sql_types_candidates_per_column_idx);
    }
    if ((char)best_sql_types_candidates_per_column_idx[1]._M_h._M_bucket_count != '\0') {
      bVar9 = *(byte *)((long)&best_sql_types_candidates_per_column_idx[1]._M_h._M_bucket_count + 1)
      ;
    }
    if ((bVar9 & 1) == 0) {
      *(undefined2 *)
       &best_header_row[5].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
        super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = 0;
      pHVar29 = best_header_row[5].
                super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pHVar29 != (pointer)0x0) {
        iVar21 = 0;
        do {
          col_name_nfkd._M_dataplus._M_p = (pointer)&col_name_nfkd.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&col_name_nfkd,"column","");
          GenerateColumnName(&error.error_message,(idx_t)pHVar29,iVar21,&col_name_nfkd);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&error.error_message);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)error.error_message._M_dataplus._M_p != &error.error_message.field_2) {
            operator_delete(error.error_message._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)col_name_nfkd._M_dataplus._M_p != &col_name_nfkd.field_2) {
            operator_delete(col_name_nfkd._M_dataplus._M_p);
          }
          iVar21 = iVar21 + 1;
          pHVar29 = best_header_row[5].
                    super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                    super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        } while (iVar21 < pHVar29);
      }
    }
    else {
      *(undefined2 *)
       &best_header_row[5].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
        super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = 0x100;
      if (((*(char *)&best_sql_types_candidates_per_column_idx[0xc]._M_h._M_rehash_policy.
                      _M_max_load_factor == '\x01') &&
          ((char)best_sql_types_candidates_per_column_idx[2]._M_h._M_bucket_count == '\0')) &&
         (pHVar29 = best_header_row[8].
                    super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                    super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                    _M_impl.super__Vector_impl_data._M_finish, pHVar29 != (pointer)0x0)) {
        *(undefined1 *)
         &best_header_row[8].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>
          .super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
          super__Vector_impl_data._M_start = 0;
        best_header_row[8].super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
        super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)((long)&pHVar29[-1].value.field_2 + 0xf);
      }
      error.error_message._M_dataplus._M_p = (pointer)&error.full_error_message.field_2;
      error.error_message._M_string_length = 1;
      error.error_message.field_2._M_allocated_capacity = 0;
      error.error_message.field_2._8_8_ = 0;
      error.full_error_message._M_dataplus._M_p._0_4_ = 0x3f800000;
      error.full_error_message._M_string_length = 0;
      error.full_error_message.field_2._M_allocated_capacity = 0;
      if ((element_type *)
          (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
          super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr) {
        __n = 0;
LAB_01502ca9:
        pvVar12 = vector<duckdb::HeaderValue,_true>::operator[]
                            ((vector<duckdb::HeaderValue,_true> *)context,__n);
        pvVar13 = vector<duckdb::HeaderValue,_true>::operator[]
                            ((vector<duckdb::HeaderValue,_true> *)context,__n);
        col_name = &pvVar12->value;
        bVar9 = *(byte *)&best_sql_types_candidates_per_column_idx[9]._M_h._M_buckets;
        sVar6 = (pvVar12->value)._M_string_length;
        if ((sVar6 != 0 && pvVar13->is_null == false) && bVar9 == 0) {
          sVar23 = 0;
          do {
            bVar28 = (col_name->_M_dataplus)._M_p[sVar23];
            if ((4 < bVar28 - 9) && (bVar28 != 0x20)) goto LAB_01502d87;
            sVar23 = sVar23 + 1;
          } while (sVar6 != sVar23);
LAB_01502cff:
          pHVar29 = best_header_row[5].
                    super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                    super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          col_name_ascii._M_dataplus._M_p = (pointer)&col_name_ascii.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&col_name_ascii,"column","");
          GenerateColumnName(&col_name_nfkd,(idx_t)pHVar29,__n,&col_name_ascii);
          ::std::__cxx11::string::operator=((string *)col_name,(string *)&col_name_nfkd);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)col_name_nfkd._M_dataplus._M_p != &col_name_nfkd.field_2) {
            operator_delete(col_name_nfkd._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)col_name_ascii._M_dataplus._M_p != &col_name_ascii.field_2) {
            operator_delete(col_name_ascii._M_dataplus._M_p);
          }
          bVar9 = *(byte *)&best_sql_types_candidates_per_column_idx[9]._M_h._M_buckets;
        }
        else if (sVar6 == 0 || pvVar13->is_null != false) goto LAB_01502cff;
LAB_01502d87:
        if ((bVar9 & 1) == 0) {
          TrimWhitespace(&col_name_nfkd,col_name);
          ::std::__cxx11::string::operator=((string *)col_name,(string *)&col_name_nfkd);
          _Var25 = col_name_nfkd._M_dataplus;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)col_name_nfkd._M_dataplus._M_p == &col_name_nfkd.field_2) goto LAB_01503097;
          goto LAB_01503272;
        }
        puVar14 = (utf8proc_uint8_t *)(pvVar12->value)._M_dataplus._M_p;
        strlen = NumericCastImpl<long,_unsigned_long,_false>::Convert
                           ((pvVar12->value)._M_string_length);
        puVar14 = utf8proc_NFKD(puVar14,strlen);
        sVar15 = ::strlen((char *)puVar14);
        col_name_nfkd._M_dataplus._M_p = (pointer)&col_name_nfkd.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&col_name_nfkd,puVar14,puVar14 + sVar15);
        free(puVar14);
        col_name_ascii._M_dataplus._M_p = (pointer)&col_name_ascii.field_2;
        col_name_ascii._M_string_length = 0;
        col_name_ascii.field_2._M_local_buf[0] = '\0';
        if (col_name_nfkd._M_string_length != 0) {
          uVar27 = 0;
          do {
            bVar9 = col_name_nfkd._M_dataplus._M_p[uVar27];
            if ((bVar9 == 0x5f) ||
               (('/' < (char)bVar9 &&
                ((bVar9 < 0x3a || ((0x40 < bVar9 && ((byte)(bVar9 + 0x9f) < 0x1a || bVar9 < 0x5b))))
                )))) {
              ::std::__cxx11::string::push_back((char)&col_name_ascii);
            }
            else if ((bVar9 - 9 < 5) || (bVar9 == 0x20)) {
              ::std::__cxx11::string::append((char *)&col_name_ascii);
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 < col_name_nfkd._M_string_length);
        }
        TrimWhitespace(&col_name_trimmed,&col_name_ascii);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        local_120._M_string_length = 0;
        local_120.field_2._M_local_buf[0] = '\0';
        if (CONCAT44(col_name_trimmed._M_string_length._4_4_,(uint)col_name_trimmed._M_string_length
                    ) == 0) {
LAB_01502fa6:
          ::std::__cxx11::string::_M_replace((ulong)&local_120,0,(char *)0x0,0x1dd10b4);
        }
        else {
          uVar27 = 0;
          bVar10 = false;
          do {
            cVar22 = col_name_trimmed._M_dataplus._M_p[uVar27];
            if (cVar22 == ' ') {
              if (!bVar10) {
                ::std::__cxx11::string::append((char *)&local_120);
              }
            }
            else {
              ::std::__cxx11::string::push_back((char)&local_120);
            }
            uVar27 = uVar27 + 1;
            bVar10 = cVar22 == ' ';
          } while (uVar27 < CONCAT44(col_name_trimmed._M_string_length._4_4_,
                                     (uint)col_name_trimmed._M_string_length));
          if (local_120._M_string_length == 0) goto LAB_01502fa6;
          StringUtil::Lower(&local_e0,&local_120);
          ::std::__cxx11::string::operator=((string *)&local_120,(string *)&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
        }
        KVar11 = KeywordHelper::KeywordCategoryType((string *)&local_120);
        if ((KVar11 < KEYWORD_COL_NAME) || ((byte)(*local_120._M_dataplus._M_p - 0x30U) < 10)) {
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_e0,"_",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_120);
          ::std::__cxx11::string::operator=((string *)&local_120,(string *)&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)col_name_trimmed._M_dataplus._M_p != &col_name_trimmed.field_2) {
          operator_delete(col_name_trimmed._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)col_name_ascii._M_dataplus._M_p != &col_name_ascii.field_2) {
          operator_delete(col_name_ascii._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)col_name_nfkd._M_dataplus._M_p != &col_name_nfkd.field_2) {
          operator_delete(col_name_nfkd._M_dataplus._M_p);
        }
        ::std::__cxx11::string::operator=((string *)col_name,(string *)&local_120);
        _Var25._M_p = local_120._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p == &local_120.field_2) goto LAB_01503097;
LAB_01503272:
        do {
          operator_delete(_Var25._M_p);
LAB_01503097:
          do {
            iVar16 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)&error,col_name);
            if (iVar16.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)__return_storage_ptr__,col_name);
              pmVar17 = ::std::__detail::
                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)&error,col_name);
              *pmVar17 = 0;
              __n = __n + 1;
              pHVar29 = (pointer)(((long)(context->
                                         super_enable_shared_from_this<duckdb::ClientContext>).
                                         __weak_this_.internal.
                                         super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_refcount._M_pi -
                                   (long)(context->
                                         super_enable_shared_from_this<duckdb::ClientContext>).
                                         __weak_this_.internal.
                                         super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr >> 3) * -0x3333333333333333);
              if (pHVar29 <= __n) goto LAB_0150338c;
              goto LAB_01502ca9;
            }
            pmVar17 = ::std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&error,col_name);
            *pmVar17 = *pmVar17 + 1;
            col_name_ascii._M_dataplus._M_p = (pointer)&col_name_ascii.field_2;
            pcVar7 = (pvVar12->value)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&col_name_ascii,pcVar7,pcVar7 + (pvVar12->value)._M_string_length);
            ::std::__cxx11::string::append((char *)&col_name_ascii);
            pmVar17 = ::std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&error,col_name);
            uVar27 = *pmVar17;
            cVar22 = '\x01';
            if (9 < uVar27) {
              uVar19 = uVar27;
              cVar8 = '\x04';
              do {
                cVar22 = cVar8;
                if (uVar19 < 100) {
                  cVar22 = cVar22 + -2;
                  goto LAB_01503154;
                }
                if (uVar19 < 1000) {
                  cVar22 = cVar22 + -1;
                  goto LAB_01503154;
                }
                if (uVar19 < 10000) goto LAB_01503154;
                bVar10 = 99999 < uVar19;
                uVar19 = uVar19 / 10000;
                cVar8 = cVar22 + '\x04';
              } while (bVar10);
              cVar22 = cVar22 + '\x01';
            }
LAB_01503154:
            col_name_trimmed._M_dataplus._M_p = (pointer)&col_name_trimmed.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&col_name_trimmed,cVar22);
            ::std::__detail::__to_chars_10_impl<unsigned_long>
                      (col_name_trimmed._M_dataplus._M_p,(uint)col_name_trimmed._M_string_length,
                       uVar27);
            uVar27 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)col_name_ascii._M_dataplus._M_p != &col_name_ascii.field_2) {
              uVar27 = CONCAT71(col_name_ascii.field_2._M_allocated_capacity._1_7_,
                                col_name_ascii.field_2._M_local_buf[0]);
            }
            uVar19 = CONCAT44(col_name_trimmed._M_string_length._4_4_,
                              (uint)col_name_trimmed._M_string_length) +
                     col_name_ascii._M_string_length;
            if (uVar27 < uVar19) {
              uVar24 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)col_name_trimmed._M_dataplus._M_p != &col_name_trimmed.field_2) {
                uVar24 = col_name_trimmed.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar24 < uVar19) goto LAB_015031cc;
              puVar18 = (undefined8 *)
                        ::std::__cxx11::string::replace
                                  ((ulong)&col_name_trimmed,0,(char *)0x0,
                                   (ulong)col_name_ascii._M_dataplus._M_p);
            }
            else {
LAB_015031cc:
              puVar18 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  ((char *)&col_name_ascii,(ulong)col_name_trimmed._M_dataplus._M_p)
              ;
            }
            col_name_nfkd._M_dataplus._M_p = (pointer)&col_name_nfkd.field_2;
            psVar1 = puVar18 + 2;
            if ((size_type *)*puVar18 == psVar1) {
              col_name_nfkd.field_2._M_allocated_capacity = *psVar1;
              col_name_nfkd.field_2._8_8_ = puVar18[3];
            }
            else {
              col_name_nfkd.field_2._M_allocated_capacity = *psVar1;
              col_name_nfkd._M_dataplus._M_p = (pointer)*puVar18;
            }
            col_name_nfkd._M_string_length = puVar18[1];
            *puVar18 = psVar1;
            puVar18[1] = 0;
            *(char *)psVar1 = '\0';
            ::std::__cxx11::string::operator=((string *)col_name,(string *)&col_name_nfkd);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)col_name_nfkd._M_dataplus._M_p != &col_name_nfkd.field_2) {
              operator_delete(col_name_nfkd._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)col_name_trimmed._M_dataplus._M_p != &col_name_trimmed.field_2) {
              operator_delete(col_name_trimmed._M_dataplus._M_p);
            }
            _Var25._M_p = col_name_ascii._M_dataplus._M_p;
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)col_name_ascii._M_dataplus._M_p == &col_name_ascii.field_2);
        } while( true );
      }
      pHVar29 = (pointer)0x0;
LAB_0150338c:
      total_cols = best_header_row[5].
                   super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                   super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      if (pHVar29 < total_cols) {
        if (*(char *)&best_sql_types_candidates_per_column_idx[0xc]._M_h._M_rehash_policy.
                      _M_max_load_factor != '\x01') {
          this_02 = (InternalException *)__cxa_allocate_exception(0x10);
          col_name_nfkd._M_dataplus._M_p = (pointer)&col_name_nfkd.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&col_name_nfkd,
                     "Detected header has number of columns inferior to dialect detection","");
          InternalException::InternalException(this_02,(string *)&col_name_nfkd);
          __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        do {
          col_name_ascii._M_dataplus._M_p = (pointer)&col_name_ascii.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&col_name_ascii,"column","");
          GenerateColumnName(&col_name_nfkd,(idx_t)total_cols,(idx_t)pHVar29,&col_name_ascii);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     __return_storage_ptr__,&col_name_nfkd);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)col_name_nfkd._M_dataplus._M_p != &col_name_nfkd.field_2) {
            operator_delete(col_name_nfkd._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)col_name_ascii._M_dataplus._M_p != &col_name_ascii.field_2) {
            operator_delete(col_name_ascii._M_dataplus._M_p);
          }
          pHVar29 = (pointer)&pHVar29->field_0x1;
          total_cols = best_header_row[5].
                       super_vector<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>.
                       super__Vector_base<duckdb::HeaderValue,_std::allocator<duckdb::HeaderValue>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
        } while (pHVar29 < total_cols);
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&error);
    }
    ReplaceNames((duckdb *)__return_storage_ptr__,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)best_header_row,local_100,best_sql_types_candidates_per_column_idx,
                 (CSVReaderOptions *)
                 (ulong)(byte)(options->dialect_options).state_machine_options.delimiter.field_0x1,
                 (MultiFileOptions *)
                 (ulong)(byte)(options->dialect_options).state_machine_options.delimiter.field_0x3,
                 (vector<duckdb::HeaderValue,_true> *)context,(CSVErrorHandler *)file_options);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string> CSVSniffer::DetectHeaderInternal(
    ClientContext &context, vector<HeaderValue> &best_header_row, CSVStateMachine &state_machine,
    const SetColumns &set_columns, unordered_map<idx_t, vector<LogicalType>> &best_sql_types_candidates_per_column_idx,
    CSVReaderOptions &options, const MultiFileOptions &file_options, CSVErrorHandler &error_handler) {
	vector<string> detected_names;
	auto &dialect_options = state_machine.dialect_options;
	dialect_options.num_cols = best_sql_types_candidates_per_column_idx.size();
	if (best_header_row.empty()) {
		dialect_options.header = false;
		for (idx_t col = 0; col < dialect_options.num_cols; col++) {
			detected_names.push_back(GenerateColumnName(dialect_options.num_cols, col));
		}
		// If the user provided names, we must replace our header with the user provided names
		ReplaceNames(detected_names, state_machine, best_sql_types_candidates_per_column_idx, options, file_options,
		             best_header_row, error_handler);
		return detected_names;
	}
	// information for header detection
	// check if header row is all null and/or consistent with detected column data types
	// If null-padding is not allowed and there is a mismatch between our header candidate and the number of columns
	// We can't detect the dialect/type options properly
	if (!options.null_padding && best_sql_types_candidates_per_column_idx.size() != best_header_row.size()) {
		if (options.ignore_errors.GetValue()) {
			dialect_options.header = false;
			for (idx_t col = 0; col < dialect_options.num_cols; col++) {
				detected_names.push_back(GenerateColumnName(dialect_options.num_cols, col));
			}
			dialect_options.rows_until_header += 1;
			ReplaceNames(detected_names, state_machine, best_sql_types_candidates_per_column_idx, options, file_options,
			             best_header_row, error_handler);
			return detected_names;
		}
		auto error =
		    CSVError::HeaderSniffingError(options, best_header_row, best_sql_types_candidates_per_column_idx.size(),
		                                  state_machine.dialect_options.state_machine_options.delimiter.GetValue());
		error_handler.Error(error);
	}
	bool has_header;

	if (set_columns.IsSet()) {
		has_header = DetectHeaderWithSetColumn(context, best_header_row, set_columns, options);
	} else {
		bool first_row_consistent = true;
		bool all_varchar = true;
		bool first_row_nulls = true;
		for (idx_t col = 0; col < best_header_row.size(); col++) {
			if (!best_header_row[col].IsNull()) {
				first_row_nulls = false;
			}
			// try cast to sql_type of column
			const auto &sql_type = best_sql_types_candidates_per_column_idx[col].back();
			if (sql_type != LogicalType::VARCHAR) {
				all_varchar = false;
				if (!CanYouCastIt(context, best_header_row[col].value, sql_type, dialect_options,
				                  best_header_row[col].IsNull(), options.decimal_separator[0])) {
					first_row_consistent = false;
				}
			}
		}
		// Our header is only false if types are not all varchar, and rows are consistent
		if (all_varchar || first_row_nulls) {
			has_header = true;
		} else {
			has_header = !first_row_consistent;
		}
	}

	if (options.dialect_options.header.IsSetByUser()) {
		// Header is defined by user, use that.
		has_header = options.dialect_options.header.GetValue();
	}
	// update parser info, and read, generate & set col_names based on previous findings
	if (has_header) {
		dialect_options.header = true;
		if (options.null_padding && !options.dialect_options.skip_rows.IsSetByUser()) {
			if (dialect_options.skip_rows.GetValue() > 0) {
				dialect_options.skip_rows = dialect_options.skip_rows.GetValue() - 1;
			}
		}
		case_insensitive_map_t<idx_t> name_collision_count;

		// get header names from CSV
		for (idx_t col = 0; col < best_header_row.size(); col++) {
			string &col_name = best_header_row[col].value;

			// generate name if field is empty
			if (EmptyHeader(col_name, best_header_row[col].is_null, options.normalize_names)) {
				col_name = GenerateColumnName(dialect_options.num_cols, col);
			}

			// normalize names or at least trim whitespace
			if (options.normalize_names) {
				col_name = NormalizeColumnName(col_name);
			} else {
				col_name = TrimWhitespace(col_name);
			}

			// avoid duplicate header names
			while (name_collision_count.find(col_name) != name_collision_count.end()) {
				name_collision_count[col_name] += 1;
				col_name = col_name + "_" + to_string(name_collision_count[col_name]);
			}
			detected_names.push_back(col_name);
			name_collision_count[col_name] = 0;
		}
		if (best_header_row.size() < dialect_options.num_cols && options.null_padding) {
			for (idx_t col = best_header_row.size(); col < dialect_options.num_cols; col++) {
				detected_names.push_back(GenerateColumnName(dialect_options.num_cols, col));
			}
		} else if (best_header_row.size() < dialect_options.num_cols) {
			throw InternalException("Detected header has number of columns inferior to dialect detection");
		}

	} else {
		dialect_options.header = false;
		for (idx_t col = 0; col < dialect_options.num_cols; col++) {
			detected_names.push_back(GenerateColumnName(dialect_options.num_cols, col));
		}
	}

	// If the user provided names, we must replace our header with the user provided names
	ReplaceNames(detected_names, state_machine, best_sql_types_candidates_per_column_idx, options, file_options,
	             best_header_row, error_handler);
	return detected_names;
}